

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

double entropy<unsigned_long>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *freqs,size_t freqs_sum)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  unsigned_long *f;
  pointer puVar3;
  undefined1 auVar4 [16];
  double __x;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var [56];
  
  auVar4 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,freqs_sum);
  puVar1 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  auVar5 = ZEXT864(0) << 0x40;
  for (puVar3 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0) {
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,*puVar3);
      __x = auVar2._0_8_ / auVar4._0_8_;
      auVar6._0_8_ = log2(__x);
      auVar6._8_56_ = extraout_var;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = __x;
      auVar2 = vfmadd231sd_fma(auVar5._0_16_,auVar6._0_16_,auVar2);
      auVar5 = ZEXT1664(auVar2);
    }
  }
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar5._0_16_,auVar4);
  return auVar4._0_8_;
}

Assistant:

double entropy(const std::vector<X>& freqs, size_t freqs_sum)
{
    double H0 = 0.0;
    double n = freqs_sum;
    for (const auto& f : freqs) {
        if (f != 0) {
            double p = double(f) / n;
            H0 += (p * log2(p));
        }
    }
    return -H0;
}